

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  _Hash_node_base *this_00;
  cmake *this_01;
  bool bVar1;
  PolicyStatus PVar2;
  TargetType TVar3;
  cmValue cVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  __node_base *p_Var7;
  pointer pbVar8;
  string_view arg;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string dirs;
  ostringstream w;
  
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0019,false);
  if (PVar2 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dirs,"INCLUDE_DIRECTORIES",(allocator<char> *)&orig);
    cVar4 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (cVar4.Value != (string *)0x0) {
      bVar1 = mightExpandVariablesCMP0019(((cVar4.Value)->_M_dataplus)._M_p);
      if (bVar1) {
        std::__cxx11::string::string((string *)&dirs,(string *)cVar4.Value);
        ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
        if (PVar2 == WARN) {
          bVar1 = std::operator!=(&dirs,cVar4.Value);
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)cVar4.Value);
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"as\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)&dirs);
            std::operator<<(poVar5,"\n");
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&orig,"INCLUDE_DIRECTORIES",(allocator<char> *)&linkLibs);
        SetProperty(this,&orig,&dirs);
        std::__cxx11::string::~string((string *)&orig);
        std::__cxx11::string::~string((string *)&dirs);
      }
    }
    p_Var7 = &(this->Targets)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      this_00 = p_Var7 + 5;
      TVar3 = cmTarget::GetType((cmTarget *)this_00);
      if (TVar3 != INTERFACE_LIBRARY) {
        TVar3 = cmTarget::GetType((cmTarget *)this_00);
        if (TVar3 != GLOBAL_TARGET) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dirs,"INCLUDE_DIRECTORIES",(allocator<char> *)&orig);
          cVar4 = cmTarget::GetProperty((cmTarget *)this_00,&dirs);
          std::__cxx11::string::~string((string *)&dirs);
          if (cVar4.Value != (string *)0x0) {
            bVar1 = mightExpandVariablesCMP0019(((cVar4.Value)->_M_dataplus)._M_p);
            if (bVar1) {
              std::__cxx11::string::string((string *)&dirs,(string *)cVar4.Value);
              ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
              if (PVar2 == WARN) {
                bVar1 = std::operator!=(&dirs,cVar4.Value);
                if (bVar1) {
                  poVar5 = std::operator<<((ostream *)&w,"Evaluated target ");
                  psVar6 = cmTarget::GetName_abi_cxx11_((cmTarget *)this_00);
                  poVar5 = std::operator<<(poVar5,(string *)psVar6);
                  poVar5 = std::operator<<(poVar5," INCLUDE_DIRECTORIES\n");
                  poVar5 = std::operator<<(poVar5,"  ");
                  poVar5 = std::operator<<(poVar5,(string *)cVar4.Value);
                  poVar5 = std::operator<<(poVar5,"\n");
                  poVar5 = std::operator<<(poVar5,"as\n");
                  poVar5 = std::operator<<(poVar5,"  ");
                  poVar5 = std::operator<<(poVar5,(string *)&dirs);
                  std::operator<<(poVar5,"\n");
                }
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&orig,"INCLUDE_DIRECTORIES",(allocator<char> *)&linkLibs);
              cmTarget::SetProperty((cmTarget *)this_00,&orig,&dirs);
              std::__cxx11::string::~string((string *)&orig);
              std::__cxx11::string::~string((string *)&dirs);
            }
          }
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dirs,"LINK_DIRECTORIES",(allocator<char> *)&orig);
    cVar4 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (cVar4.Value != (string *)0x0) {
      bVar1 = mightExpandVariablesCMP0019(((cVar4.Value)->_M_dataplus)._M_p);
      if (bVar1) {
        std::__cxx11::string::string((string *)&dirs,(string *)cVar4.Value);
        std::__cxx11::string::string((string *)&orig,(string *)&dirs);
        ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
        if (PVar2 == WARN) {
          bVar1 = std::operator!=(&dirs,&orig);
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)&w,"Evaluated link directories\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)&orig);
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"as\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)&dirs);
            std::operator<<(poVar5,"\n");
          }
        }
        std::__cxx11::string::~string((string *)&orig);
        std::__cxx11::string::~string((string *)&dirs);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dirs,"LINK_LIBRARIES",(allocator<char> *)&orig);
    cVar4 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (cVar4.Value != (string *)0x0) {
      arg._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar4.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&linkLibs,arg,false);
      for (pbVar8 = linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        std::__cxx11::string::string((string *)&dirs,(string *)pbVar8);
        __x._M_str = dirs._M_dataplus._M_p;
        __x._M_len = dirs._M_string_length;
        __y._M_str = "optimized";
        __y._M_len = 9;
        bVar1 = std::operator==(__x,__y);
        if (bVar1) {
LAB_0018e0d7:
          pbVar8 = pbVar8 + 1;
          std::__cxx11::string::_M_assign((string *)&dirs);
        }
        else {
          __x_00._M_str = dirs._M_dataplus._M_p;
          __x_00._M_len = dirs._M_string_length;
          __y_00._M_str = "debug";
          __y_00._M_len = 5;
          bVar1 = std::operator==(__x_00,__y_00);
          if (bVar1) goto LAB_0018e0d7;
        }
        bVar1 = mightExpandVariablesCMP0019(dirs._M_dataplus._M_p);
        if (bVar1) {
          std::__cxx11::string::string((string *)&orig,(string *)&dirs);
          ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
          if (PVar2 == WARN) {
            bVar1 = std::operator!=(&dirs,&orig);
            if (bVar1) {
              poVar5 = std::operator<<((ostream *)&w,"Evaluated link library\n");
              poVar5 = std::operator<<(poVar5,"  ");
              poVar5 = std::operator<<(poVar5,(string *)&orig);
              poVar5 = std::operator<<(poVar5,"\n");
              poVar5 = std::operator<<(poVar5,"as\n");
              poVar5 = std::operator<<(poVar5,"  ");
              poVar5 = std::operator<<(poVar5,(string *)&dirs);
              std::operator<<(poVar5,"\n");
            }
          }
          std::__cxx11::string::~string((string *)&orig);
        }
        std::__cxx11::string::~string((string *)&dirs);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&linkLibs);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&dirs);
    if (dirs._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&orig,(cmPolicies *)&DAT_00000013,id);
      poVar5 = std::operator<<((ostream *)&dirs,(string *)&orig);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"The following variable evaluations were encountered:\n");
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar5,(string *)&linkLibs);
      std::__cxx11::string::~string((string *)&linkLibs);
      std::__cxx11::string::~string((string *)&orig);
      this_01 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&orig,&this->Backtrace);
      std::__cxx11::string::~string((string *)&orig);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  cmValue includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (includeDirs && mightExpandVariablesCMP0019(includeDirs->c_str())) {
    std::string dirs = *includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != *includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << *includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs);
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (includeDirs && mightExpandVariablesCMP0019(includeDirs->c_str())) {
      std::string dirs = *includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != *includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << *includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs);
    }
  }

  if (cmValue linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp->c_str())) {
      std::string d = *linkDirsProp;
      const std::string orig = d;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (cmValue linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs = cmExpandedList(*linkLibsProp);

    for (auto l = linkLibs.begin(); l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized"_s || libName == "debug"_s) {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        const std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           m.str(), this->Backtrace);
  }
}